

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestSuite::Skip(TestSuite *this)

{
  int iVar1;
  UnitTestImpl *this_00;
  UnitTest *this_01;
  TestEventListeners *this_02;
  TestEventListener *pTVar2;
  TestInfo *this_03;
  int local_24;
  int i;
  TestEventListener *repeater;
  UnitTestImpl *impl;
  TestSuite *this_local;
  
  if ((this->should_run_ & 1U) != 0) {
    this_00 = internal::GetUnitTestImpl();
    internal::UnitTestImpl::set_current_test_suite(this_00,this);
    this_01 = UnitTest::GetInstance();
    this_02 = UnitTest::listeners(this_01);
    pTVar2 = TestEventListeners::repeater(this_02);
    (*pTVar2->_vptr_TestEventListener[6])(pTVar2,this);
    (*pTVar2->_vptr_TestEventListener[7])(pTVar2,this);
    for (local_24 = 0; iVar1 = total_test_count(this), local_24 < iVar1; local_24 = local_24 + 1) {
      this_03 = GetMutableTestInfo(this,local_24);
      TestInfo::Skip(this_03);
    }
    (*pTVar2->_vptr_TestEventListener[0xb])(pTVar2,this);
    (*pTVar2->_vptr_TestEventListener[0xc])(pTVar2,this);
    internal::UnitTestImpl::set_current_test_suite(this_00,(TestSuite *)0x0);
  }
  return;
}

Assistant:

void TestSuite::Skip() {
  if (!should_run_) return;

  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_suite(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Call both legacy and the new API
  repeater->OnTestSuiteStart(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseStart(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  for (int i = 0; i < total_test_count(); i++) {
    GetMutableTestInfo(i)->Skip();
  }

  // Call both legacy and the new API
  repeater->OnTestSuiteEnd(*this);
  // Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseEnd(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  impl->set_current_test_suite(nullptr);
}